

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounds.c
# Opt level: O3

int dotalk(void)

{
  byte *pbVar1;
  permonst *ppVar2;
  ulong uVar3;
  level *lev;
  boolean bVar4;
  boolean bVar5;
  int iVar6;
  uint uVar7;
  ulong in_RAX;
  obj *poVar8;
  char cVar9;
  ulong in_RDX;
  ulong extraout_RDX;
  long lVar10;
  char *pcVar11;
  monst *pmVar12;
  char *line;
  int iVar13;
  int iVar14;
  schar dy;
  schar dx;
  undefined8 local_38;
  
  bVar4 = flags.soundok;
  flags.soundok = '\x01';
  local_38 = in_RAX;
  if ((youmonst.data)->msound == '\0') {
    pcVar11 = mons_mname(youmonst.data);
    pcVar11 = an(pcVar11);
    line = "As %s, you cannot speak.";
LAB_00247ef8:
    pline(line,pcVar11);
  }
  else {
    if (u.uprops[0x22].intrinsic == 0) {
      if ((u._1052_1_ & 1) == 0) {
        if ((u._1052_1_ & 2) == 0) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00247f29;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00247f24;
LAB_00247f72:
            poVar8 = shop_object(u.ux,u.uy);
            in_RDX = extraout_RDX;
            if (poVar8 != (obj *)0x0) {
              price_quote(poVar8);
              flags.soundok = bVar4;
              return 1;
            }
          }
          else {
LAB_00247f24:
            if (ublindf != (obj *)0x0) {
LAB_00247f29:
              if (ublindf->oartifact == '\x1d') goto LAB_00247f72;
            }
          }
          local_38 = CONCAT71(local_38._1_7_,bVar4);
          iVar14 = -1;
          iVar13 = 0;
          do {
            lVar10 = -1;
            do {
              if ((int)lVar10 == 0 && iVar14 == 0) {
                if (u.usteed != (monst *)0x0) {
                  iVar13 = iVar13 + 1;
                  uVar3 = local_38 >> 0x10;
                  local_38._0_2_ = CONCAT11(1,(char)local_38);
                  local_38 = CONCAT62((int6)uVar3,(undefined2)local_38) & 0xffffffff0000ffff;
                  in_RDX = CONCAT71((int7)(in_RDX >> 8),1);
                }
              }
              else {
                pmVar12 = level->monsters[(long)u.ux + (long)iVar14][u.uy + lVar10];
                if ((pmVar12 != (monst *)0x0) &&
                   (uVar7 = *(uint *)&pmVar12->field_0x60, (uVar7 >> 9 & 1) == 0)) {
                  local_38 = CONCAT44((int)in_RDX,(undefined4)local_38);
                  if (pmVar12->wormno == '\0') {
                    if ((viz_array[pmVar12->my][pmVar12->mx] & 2U) != 0) goto LAB_002480e7;
                    if (u.uprops[0x1e].intrinsic == 0) {
                      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00248088;
                      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0024807f;
                    }
                    else {
LAB_0024807f:
                      if (ublindf == (obj *)0x0) goto LAB_00248134;
LAB_00248088:
                      if (ublindf->oartifact != '\x1d') goto LAB_00248134;
                    }
                    if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                         (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                        ((viz_array[pmVar12->my][pmVar12->mx] & 1U) != 0)) &&
                       ((pmVar12->data->mflags3 & 0x200) != 0)) goto LAB_002480e7;
LAB_00248134:
                    if (((pmVar12->data->mflags1 & 0x10000) == 0) &&
                       ((poVar8 = which_armor(pmVar12,4), poVar8 == (obj *)0x0 ||
                        (poVar8 = which_armor(pmVar12,4), poVar8->otyp != 0x4f)))) {
                      if (u.uprops[0x1e].intrinsic == 0) {
                        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00248193;
                        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0024818e;
                      }
                      else {
LAB_0024818e:
                        if (ublindf != (obj *)0x0) {
LAB_00248193:
                          if (ublindf->oartifact == '\x1d') goto LAB_00248225;
                        }
                        if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                             youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0))
                        goto LAB_00248282;
                      }
LAB_00248225:
                      if ((u.uprops[0x19].extrinsic != 0) &&
                         ((u.uprops[0x19].blocked == 0 &&
                          (iVar6 = dist2((int)pmVar12->mx,(int)pmVar12->my,(int)u.ux,(int)u.uy),
                          iVar6 < 0x41)))) goto LAB_00248282;
                    }
                    if ((u.uprops[0x42].intrinsic == 0) &&
                       ((u.uprops[0x42].extrinsic == 0 &&
                        (bVar4 = match_warn_of_mon(pmVar12), bVar4 == '\0')))) {
                      in_RDX = local_38 >> 0x20;
                      goto LAB_00248296;
                    }
                  }
                  else {
                    bVar4 = worm_known(level,pmVar12);
                    if (bVar4 == '\0') goto LAB_00248134;
                    uVar7 = *(uint *)&pmVar12->field_0x60;
LAB_002480e7:
                    if ((((uVar7 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
                       (u.uprops[0xc].extrinsic == 0)) {
                      if (((uVar7 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
                      goto LAB_00248126;
                      goto LAB_00248134;
                    }
                    if ((uVar7 & 0x280) != 0) goto LAB_00248134;
LAB_00248126:
                    if ((u._1052_1_ & 0x20) != 0) goto LAB_00248134;
                  }
LAB_00248282:
                  iVar13 = iVar13 + 1;
                  local_38 = CONCAT53(CONCAT41(local_38._4_4_,(char)iVar14),
                                      CONCAT12((char)lVar10,(undefined2)local_38));
                  local_38 = CONCAT62(local_38._2_6_,(undefined2)local_38) & 0xffffffffffff00ff;
                  in_RDX = 0;
                }
              }
LAB_00248296:
              lVar10 = lVar10 + 1;
            } while ((int)lVar10 != 2);
            iVar14 = iVar14 + 1;
          } while (iVar14 != 2);
          bVar4 = (boolean)local_38;
          if ((iVar13 != 1) || (iflags.paranoid_chat != '\0')) {
            iVar13 = getdir("Talk to whom? (in what direction)",(schar *)((long)&local_38 + 3),
                            (schar *)((long)&local_38 + 2),(schar *)((long)&local_38 + 1));
            if (iVar13 == 0) {
              flags.soundok = bVar4;
              return 0;
            }
            in_RDX = local_38 >> 8 & 0xff;
          }
          lev = level;
          cVar9 = (char)in_RDX;
          if (cVar9 < '\x01' || u.usteed == (monst *)0x0) {
            if (cVar9 != '\0') {
              pcVar11 = "down";
              if (cVar9 < '\0') {
                pcVar11 = "up";
              }
              line = "They won\'t hear you %s there.";
              goto LAB_00247ef8;
            }
            if (local_38._3_1_ == '\0' && local_38._2_1_ == '\0') {
              pcVar11 = "Talking to yourself is a bad habit for a dungeoneer.";
              goto LAB_00247f41;
            }
            pmVar12 = level->monsters[(long)u.ux + (long)local_38._3_1_]
                      [(long)u.uy + (long)local_38._2_1_];
            if (pmVar12 == (monst *)0x0) {
              flags.soundok = bVar4;
              return 0;
            }
            uVar7 = *(uint *)&pmVar12->field_0x60;
            if ((uVar7 & 0x280) != 0) {
              flags.soundok = bVar4;
              return 0;
            }
            if ((byte)(pmVar12->m_ap_type - 1) < 2) {
              flags.soundok = bVar4;
              return 0;
            }
            if (((byte)(uVar7 >> 0x1c) & 1) != 0 || (uVar7 & 0xc0000) == 0x40000) {
              pbVar1 = (byte *)((long)&pmVar12->mstrategy + 3);
              *pbVar1 = *pbVar1 & 0xcf;
              if ((pmVar12->mtame == '\0') || (pmVar12->meating == 0)) {
                if (urole.malenum != 0x15d) {
LAB_00248327:
                  iVar13 = domonnoise(pmVar12);
                  flags.soundok = bVar4;
                  return iVar13;
                }
                ppVar2 = pmVar12->data;
                if (((pmVar12->mtame != '\0') || ((uVar7 & 0x400000) != 0)) ||
                   (((ppVar2 != mons + 0x5c && ppVar2 != mons + 0x5e) &&
                    (ppVar2 != mons + 0x5a && ppVar2 != mons + 0x5b)) && ppVar2 != mons + 0x5f))
                goto LAB_00248327;
                uVar7 = rnl((int)CONCAT71((int7)((ulong)lev >> 8),ppVar2 != mons + 0x5b));
                l_monnam(pmVar12);
                pline("You attempt to soothe the %s with chittering sounds.");
                if (uVar7 < 2) {
                  tamedog(pmVar12,(obj *)0x0);
                }
                else if (uVar7 < 9) {
                  pmVar12->field_0x62 = pmVar12->field_0x62 | 0x40;
                  set_malign(pmVar12);
                }
                else {
                  pcVar11 = Monnam(pmVar12);
                  pline("%s unfortunately ignores your overtures.",pcVar11);
                }
                iVar13 = 1;
                goto LAB_00248a25;
              }
              if (pmVar12->wormno == '\0') {
                if ((viz_array[pmVar12->my][pmVar12->mx] & 2U) != 0) goto LAB_00248864;
                if (u.uprops[0x1e].intrinsic == 0) {
                  if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002485bb;
                  if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002485b2;
                }
                else {
LAB_002485b2:
                  if (ublindf == (obj *)0x0) goto LAB_002488ac;
LAB_002485bb:
                  if (ublindf->oartifact != '\x1d') goto LAB_002488ac;
                }
                if (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                    (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                   (((viz_array[pmVar12->my][pmVar12->mx] & 1U) != 0 &&
                    ((pmVar12->data->mflags3 & 0x200) != 0)))) goto LAB_00248864;
LAB_002488ac:
                if (((pmVar12->data->mflags1 & 0x10000) == 0) &&
                   ((poVar8 = which_armor(pmVar12,4), poVar8 == (obj *)0x0 ||
                    (poVar8 = which_armor(pmVar12,4), poVar8->otyp != 0x4f)))) {
                  if (u.uprops[0x1e].intrinsic == 0) {
                    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00248904;
                    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002488ff;
                  }
                  else {
LAB_002488ff:
                    if (ublindf != (obj *)0x0) {
LAB_00248904:
                      if (ublindf->oartifact == '\x1d') goto LAB_00248997;
                    }
                    if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                         (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                         youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0))
                    goto LAB_00248a0a;
                  }
LAB_00248997:
                  if ((u.uprops[0x19].extrinsic != 0) &&
                     ((u.uprops[0x19].blocked == 0 &&
                      (iVar13 = dist2((int)pmVar12->mx,(int)pmVar12->my,(int)u.ux,(int)u.uy),
                      iVar13 < 0x41)))) goto LAB_00248a0a;
                }
                if ((u.uprops[0x42].intrinsic == 0) &&
                   ((u.uprops[0x42].extrinsic == 0 &&
                    (bVar4 = match_warn_of_mon(pmVar12), bVar4 == '\0')))) {
                  map_invisible(pmVar12->mx,pmVar12->my);
                }
              }
              else {
                bVar4 = worm_known(lev,pmVar12);
                if (bVar4 == '\0') goto LAB_002488ac;
                uVar7 = *(uint *)&pmVar12->field_0x60;
LAB_00248864:
                if ((((uVar7 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
                   (u.uprops[0xc].extrinsic == 0)) {
                  if (((uVar7 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
                  goto LAB_0024889f;
                  goto LAB_002488ac;
                }
                if ((uVar7 & 0x280) != 0) goto LAB_002488ac;
LAB_0024889f:
                if ((u._1052_1_ & 0x20) != 0) goto LAB_002488ac;
              }
LAB_00248a0a:
              pcVar11 = Monnam(pmVar12);
              iVar13 = 0;
              pline("%s is eating noisily.",pcVar11);
LAB_00248a25:
              flags.soundok = (boolean)local_38;
              return iVar13;
            }
            if (pmVar12->wormno == '\0') {
              if ((viz_array[pmVar12->my][pmVar12->mx] & 2U) != 0) goto LAB_0024864d;
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00248561;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00248558;
              }
              else {
LAB_00248558:
                if (ublindf == (obj *)0x0) goto LAB_00248698;
LAB_00248561:
                if (ublindf->oartifact != '\x1d') goto LAB_00248698;
              }
              if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                   (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                  ((viz_array[pmVar12->my][pmVar12->mx] & 1U) != 0)) &&
                 ((pmVar12->data->mflags3 & 0x200) != 0)) goto LAB_0024864d;
LAB_00248698:
              if (((pmVar12->data->mflags1 & 0x10000) == 0) &&
                 ((poVar8 = which_armor(pmVar12,4), poVar8 == (obj *)0x0 ||
                  (poVar8 = which_armor(pmVar12,4), poVar8->otyp != 0x4f)))) {
                if (u.uprops[0x1e].intrinsic == 0) {
                  if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002486f7;
                  if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002486f2;
                }
                else {
LAB_002486f2:
                  if (ublindf != (obj *)0x0) {
LAB_002486f7:
                    if (ublindf->oartifact == '\x1d') goto LAB_00248786;
                  }
                  if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                       (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                       youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0))
                  goto LAB_002487e0;
                }
LAB_00248786:
                if ((u.uprops[0x19].extrinsic != 0) &&
                   ((u.uprops[0x19].blocked == 0 &&
                    (iVar13 = dist2((int)pmVar12->mx,(int)pmVar12->my,(int)u.ux,(int)u.uy),
                    iVar13 < 0x41)))) goto LAB_002487e0;
              }
              if ((u.uprops[0x42].intrinsic == 0) &&
                 ((u.uprops[0x42].extrinsic == 0 &&
                  (bVar5 = match_warn_of_mon(pmVar12), bVar5 == '\0')))) {
                flags.soundok = bVar4;
                return 0;
              }
            }
            else {
              bVar5 = worm_known(level,pmVar12);
              if (bVar5 == '\0') goto LAB_00248698;
              uVar7 = *(uint *)&pmVar12->field_0x60;
LAB_0024864d:
              if ((((uVar7 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
                 (u.uprops[0xc].extrinsic == 0)) {
                if (((uVar7 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
                goto LAB_0024868a;
                goto LAB_00248698;
              }
              if ((uVar7 & 0x280) != 0) goto LAB_00248698;
LAB_0024868a:
              if ((u._1052_1_ & 0x20) != 0) goto LAB_00248698;
            }
LAB_002487e0:
            pcVar11 = Monnam(pmVar12);
            line = "%s seems not to notice you.";
            goto LAB_00247ef8;
          }
          pmVar12 = u.usteed;
          if ((*(uint *)&(u.usteed)->field_0x60 & 0xc0000) == 0x40000) goto LAB_00248327;
          pcVar11 = "Your steed remains silent...";
        }
        else {
          pcVar11 = "Your speech is unintelligible underwater.";
        }
      }
      else {
        pcVar11 = "They won\'t hear you out there.";
      }
    }
    else {
      pcVar11 = "You can\'t speak.  You\'re choking!";
    }
LAB_00247f41:
    pline(pcVar11);
  }
  flags.soundok = bVar4;
  return 0;
}

Assistant:

int dotalk(void)
{
    int result;
    boolean save_soundok = flags.soundok;
    flags.soundok = 1;	/* always allow sounds while chatting */
    result = dochat();
    flags.soundok = save_soundok;
    return result;
}